

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O0

string * __thiscall
t_js_generator::ts_function_signature_abi_cxx11_
          (string *__return_storage_ptr__,t_js_generator *this,t_function *tfunction,
          bool include_callback)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  t_struct *this_00;
  members_type *this_01;
  string *psVar4;
  size_type sVar5;
  reference pptVar6;
  undefined4 extraout_var;
  t_program *ptVar7;
  undefined4 extraout_var_00;
  t_type *ptVar8;
  string local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  string local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  string local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  string local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_178
  ;
  t_type *local_170;
  t_type *t;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_160
  ;
  const_iterator it;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  string exception_types;
  t_struct *exceptions;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_120
  ;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_78;
  t_field **local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_48;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  bool include_callback_local;
  t_function *tfunction_local;
  t_js_generator *this_local;
  string *str;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  this_00 = t_function::get_arglist(tfunction);
  this_01 = t_struct::get_members(this_00);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_48);
  psVar4 = t_function::get_name_abi_cxx11_(tfunction);
  std::operator+(&local_68,psVar4,"(");
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  local_70 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_01);
  local_48._M_current = local_70;
  while( true ) {
    local_78._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_01);
    bVar1 = __gnu_cxx::operator!=(&local_48,&local_78);
    if (!bVar1) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_48);
    psVar4 = t_field::get_name_abi_cxx11_(*pptVar6);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_48);
    ts_get_req_abi_cxx11_(&local_f8,this,*pptVar6);
    std::operator+(&local_d8,psVar4,&local_f8);
    std::operator+(&local_b8,&local_d8,": ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_48);
    ptVar8 = t_field::get_type(*pptVar6);
    ts_get_type_abi_cxx11_(&local_118,this,ptVar8);
    std::operator+(&local_98,&local_b8,&local_118);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    local_120 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator+(&local_48,1);
    exceptions = (t_struct *)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_01);
    bVar2 = __gnu_cxx::operator!=
                      (&local_120,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&exceptions);
    bVar1 = true;
    if ((!bVar2) && (bVar1 = false, include_callback)) {
      sVar5 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size(this_01);
      bVar1 = sVar5 != 0;
    }
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_48);
  }
  if (include_callback) {
    if ((this->gen_node_ & 1U) == 0) {
      ptVar8 = t_function::get_returntype(tfunction);
      ts_get_type_abi_cxx11_(&local_378,this,ptVar8);
      std::operator+(&local_358,"callback?: (data: ",&local_378);
      std::operator+(&local_338,&local_358,")=>void): ");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_338);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_378);
    }
    else {
      exception_types.field_2._8_8_ = t_function::get_xceptions(tfunction);
      std::__cxx11::string::string((string *)&members);
      if (exception_types.field_2._8_8_ != 0) {
        it._M_current = (t_field **)t_struct::get_members((t_struct *)exception_types.field_2._8_8_)
        ;
        local_160._M_current =
             (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin
                       ((vector<t_field_*,_std::allocator<t_field_*>_> *)it._M_current);
        while( true ) {
          t = (t_type *)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                        ((vector<t_field_*,_std::allocator<t_field_*>_> *)it._M_current);
          bVar1 = __gnu_cxx::operator!=
                            (&local_160,
                             (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)&t);
          if (!bVar1) break;
          pptVar6 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&local_160);
          ptVar8 = t_field::get_type(*pptVar6);
          local_170 = t_generator::get_true_type(ptVar8);
          local_178._M_current =
               (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(it._M_current);
          bVar1 = __gnu_cxx::operator==(&local_160,&local_178);
          if (bVar1) {
            ptVar7 = t_type::get_program(local_170);
            js_type_namespace_abi_cxx11_(&local_1b8,this,ptVar7);
            iVar3 = (*(local_170->super_t_doc)._vptr_t_doc[3])();
            std::operator+(&local_198,&local_1b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var,iVar3));
            std::__cxx11::string::operator=((string *)&members,(string *)&local_198);
            std::__cxx11::string::~string((string *)&local_198);
            std::__cxx11::string::~string((string *)&local_1b8);
          }
          else {
            ptVar7 = t_type::get_program(local_170);
            js_type_namespace_abi_cxx11_(&local_218,this,ptVar7);
            std::operator+(&local_1f8," | ",&local_218);
            iVar3 = (*(local_170->super_t_doc)._vptr_t_doc[3])();
            std::operator+(&local_1d8,&local_1f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_00,iVar3));
            std::__cxx11::string::operator+=((string *)&members,(string *)&local_1d8);
            std::__cxx11::string::~string((string *)&local_1d8);
            std::__cxx11::string::~string((string *)&local_1f8);
            std::__cxx11::string::~string((string *)&local_218);
          }
          __gnu_cxx::
          __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
          operator++(&local_160);
        }
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &members,"");
      if (bVar1) {
        ptVar8 = t_function::get_returntype(tfunction);
        ts_get_type_abi_cxx11_(&local_278,this,ptVar8);
        std::operator+(&local_258,"callback?: (error: void, response: ",&local_278);
        std::operator+(&local_238,&local_258,")=>void): ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_238);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_278);
      }
      else {
        std::operator+(&local_2f8,"callback?: (error: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&members
                      );
        std::operator+(&local_2d8,&local_2f8,", response: ");
        ptVar8 = t_function::get_returntype(tfunction);
        ts_get_type_abi_cxx11_(&local_318,this,ptVar8);
        std::operator+(&local_2b8,&local_2d8,&local_318);
        std::operator+(&local_298,&local_2b8,")=>void): ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2f8);
      }
      std::__cxx11::string::~string((string *)&members);
    }
    if ((this->gen_jquery_ & 1U) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"void;");
    }
    else {
      ptVar8 = t_function::get_returntype(tfunction);
      ts_get_type_abi_cxx11_(&local_3d8,this,ptVar8);
      std::operator+(&local_3b8,"JQueryPromise<",&local_3d8);
      std::operator+(&local_398,&local_3b8,">;");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_398);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3d8);
    }
  }
  else if ((this->gen_es6_ & 1U) == 0) {
    ptVar8 = t_function::get_returntype(tfunction);
    ts_get_type_abi_cxx11_(&local_498,this,ptVar8);
    std::operator+(&local_478,"): ",&local_498);
    std::operator+(&local_458,&local_478,";");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_498);
  }
  else {
    ptVar8 = t_function::get_returntype(tfunction);
    ts_get_type_abi_cxx11_(&local_438,this,ptVar8);
    std::operator+(&local_418,"): Promise<",&local_438);
    std::operator+(&local_3f8,&local_418,">;");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_438);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string t_js_generator::ts_function_signature(t_function* tfunction, bool include_callback) {
  string str;
  const vector<t_field*>& fields = tfunction->get_arglist()->get_members();
  vector<t_field*>::const_iterator f_iter;

  str = tfunction->get_name() + "(";

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    str += (*f_iter)->get_name() + ts_get_req(*f_iter) + ": " + ts_get_type((*f_iter)->get_type());

    if (f_iter + 1 != fields.end() || (include_callback && fields.size() > 0)) {
      str += ", ";
    }
  }

  if (include_callback) {
    if (gen_node_) {
      t_struct* exceptions = tfunction->get_xceptions();
      string exception_types;
      if (exceptions) {
        const vector<t_field*>& members = exceptions->get_members();
        for (vector<t_field*>::const_iterator it = members.begin(); it != members.end(); ++it) {
          t_type* t = get_true_type((*it)->get_type());
          if (it == members.begin()) {
            exception_types = js_type_namespace(t->get_program()) + t->get_name();
          } else {
            exception_types += " | " + js_type_namespace(t->get_program()) + t->get_name();
          }
        }
      }
      if (exception_types == "") {
        str += "callback?: (error: void, response: " + ts_get_type(tfunction->get_returntype()) + ")=>void): ";
      } else {
        str += "callback?: (error: " + exception_types + ", response: " + ts_get_type(tfunction->get_returntype()) + ")=>void): ";
      }
    } else {
      str += "callback?: (data: " + ts_get_type(tfunction->get_returntype()) + ")=>void): ";
    }

    if (gen_jquery_) {
      str += "JQueryPromise<" + ts_get_type(tfunction->get_returntype()) +">;";
    } else {
      str += "void;";
    }
  } else {
    if (gen_es6_) {
      str += "): Promise<" + ts_get_type(tfunction->get_returntype()) + ">;";
    }
    else {
      str += "): " + ts_get_type(tfunction->get_returntype()) + ";";
    }
  }

  return str;
}